

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O3

void __thiscall hanabi_learning_env::HanabiState::ApplyMove(HanabiState *this,HanabiMove move)

{
  int *piVar1;
  pointer *ppHVar2;
  int iVar3;
  pointer pHVar4;
  pointer pHVar5;
  pointer pHVar6;
  pointer piVar7;
  iterator __position;
  bool bVar8;
  pair<bool,_bool> pVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *discard_pile;
  HanabiCard card;
  pointer pHVar15;
  byte bVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  int iVar20;
  HanabiHistoryItem local_98;
  CardKnowledge local_88;
  
  bVar8 = MoveIsLegal(this,move);
  if (!bVar8) {
    __assert_fail("MoveIsLegal(move)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                  ,0xde,"void hanabi_learning_env::HanabiState::ApplyMove(HanabiMove)");
  }
  if ((this->deck_).total_count_ == 0) {
    this->turns_to_play_ = this->turns_to_play_ + -1;
  }
  local_98.scored = false;
  local_98.information_token = false;
  local_98.color = -1;
  local_98.rank = -1;
  local_98.reveal_bitmask = 0;
  local_98.newly_revealed_bitmask = '\0';
  local_98.deal_to_player = -1;
  iVar10 = this->cur_player_;
  local_98.player = (int8_t)iVar10;
  cVar19 = move.color_;
  cVar18 = move.rank_;
  cVar17 = move.card_index_;
  local_98.move = move;
  switch(move.move_type_) {
  case kPlay:
    lVar12 = *(long *)&(this->hands_).
                       super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar10].cards_.
                       super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                       ._M_impl;
    lVar11 = (long)cVar17;
    local_98.color = *(int8_t *)(lVar12 + lVar11 * 8);
    local_98.rank = *(int8_t *)(lVar12 + 4 + lVar11 * 8);
    pVar9 = AddToFireworks(this,*(HanabiCard *)(lVar12 + lVar11 * 8));
    local_98.scored = pVar9.first;
    local_98.information_token = pVar9.second;
    pHVar15 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start + this->cur_player_;
    discard_pile = (vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                    *)0x0;
    if (((ushort)pVar9 & 1) == 0) {
      discard_pile = &this->discard_pile_;
    }
    goto LAB_00116549;
  case kDiscard:
    iVar3 = this->information_tokens_;
    iVar20 = this->parent_game_->max_information_tokens_;
    if (iVar3 < iVar20) {
      this->information_tokens_ = iVar3 + 1;
    }
    local_98.information_token = iVar3 < iVar20;
    pHVar6 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar15 = pHVar6 + iVar10;
    lVar12 = *(long *)&pHVar6[iVar10].cards_.
                       super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                       ._M_impl;
    local_98.color = *(int8_t *)(lVar12 + (long)cVar17 * 8);
    local_98.rank = *(int8_t *)(lVar12 + 4 + (long)cVar17 * 8);
    discard_pile = &this->discard_pile_;
LAB_00116549:
    HanabiHand::RemoveFromHand(pHVar15,(int)cVar17,discard_pile);
    break;
  case kRevealColor:
    if (this->information_tokens_ < 1) {
LAB_00116656:
      __assert_fail("information_tokens_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                    ,0x7b,"void hanabi_learning_env::HanabiState::DecrementInformationTokens()");
    }
    this->information_tokens_ = this->information_tokens_ + -1;
    pHVar15 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)(long)(move.target_offset_ + iVar10) %
             (ulong)(((long)(this->hands_).
                            super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 4) *
                    -0x5555555555555555);
    pHVar4 = *(pointer *)
              &pHVar15[uVar13].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar5 = *(pointer *)
              ((long)&pHVar15[uVar13].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    uVar14 = (long)pHVar5 - (long)pHVar4 >> 3;
    if (8 < uVar14) {
      __assert_fail("cards.size() <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                    ,0x1e,
                    "uint8_t hanabi_learning_env::(anonymous namespace)::HandColorBitmask(const HanabiHand &, int)"
                   );
    }
    if (pHVar5 == pHVar4) {
      local_98.reveal_bitmask = 0;
    }
    else {
      lVar12 = 0;
      local_98.reveal_bitmask = 0;
      do {
        bVar16 = (byte)(1 << ((byte)lVar12 & 0x1f));
        if (pHVar4[lVar12].color_ != (int)cVar19) {
          bVar16 = 0;
        }
        local_98.reveal_bitmask = local_98.reveal_bitmask | bVar16;
        lVar12 = lVar12 + 1;
      } while (uVar14 + (uVar14 == 0) != lVar12);
    }
    local_98.newly_revealed_bitmask = HanabiHand::RevealColor(pHVar15 + uVar13,(int)cVar19);
    break;
  case kRevealRank:
    if (this->information_tokens_ < 1) goto LAB_00116656;
    this->information_tokens_ = this->information_tokens_ + -1;
    pHVar15 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)(long)(move.target_offset_ + iVar10) %
             (ulong)(((long)(this->hands_).
                            super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 4) *
                    -0x5555555555555555);
    pHVar4 = *(pointer *)
              &pHVar15[uVar13].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar5 = *(pointer *)
              ((long)&pHVar15[uVar13].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    uVar14 = (long)pHVar5 - (long)pHVar4 >> 3;
    if (8 < uVar14) {
      __assert_fail("cards.size() <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                    ,0x2b,
                    "uint8_t hanabi_learning_env::(anonymous namespace)::HandRankBitmask(const HanabiHand &, int)"
                   );
    }
    if (pHVar5 == pHVar4) {
      local_98.reveal_bitmask = 0;
    }
    else {
      lVar12 = 0;
      local_98.reveal_bitmask = 0;
      do {
        bVar16 = (byte)(1 << ((byte)lVar12 & 0x1f));
        if (pHVar4[lVar12].rank_ != (int)cVar18) {
          bVar16 = 0;
        }
        local_98.reveal_bitmask = local_98.reveal_bitmask | bVar16;
        lVar12 = lVar12 + 1;
      } while (uVar14 + (uVar14 == 0) != lVar12);
    }
    local_98.newly_revealed_bitmask = HanabiHand::RevealRank(pHVar15 + uVar13,(int)cVar18);
    break;
  case kDeal:
    iVar10 = PlayerToDeal(this);
    local_98.deal_to_player = (char)iVar10;
    HanabiHand::CardKnowledge::CardKnowledge
              (&local_88,this->parent_game_->num_colors_,this->parent_game_->num_ranks_);
    if (this->parent_game_->observation_type_ == kSeer) {
      HanabiHand::ValueKnowledge::ApplyIsValueHint(&local_88.color_,(int)cVar19);
      HanabiHand::ValueKnowledge::ApplyIsValueHint(&local_88.rank_,(int)cVar18);
    }
    pHVar15 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar20 = (int)cVar19 * (this->deck_).num_ranks_ + (int)cVar18;
    piVar7 = (this->deck_).card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = piVar7[iVar20];
    if (iVar3 < 1) {
      card.color_ = -1;
      card.rank_ = -1;
    }
    else {
      piVar7[iVar20] = iVar3 + -1;
      piVar1 = &(this->deck_).total_count_;
      *piVar1 = *piVar1 + -1;
      lVar12 = (long)(this->deck_).num_ranks_;
      card = (HanabiCard)((long)iVar20 / lVar12 & 0xffffffffU | (long)iVar20 % lVar12 << 0x20);
    }
    HanabiHand::AddCard(pHVar15 + (char)iVar10,card,&local_88);
    if (local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    break;
  default:
    abort();
  }
  __position._M_current =
       (this->move_history_).
       super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->move_history_).
      super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>
    ::_M_realloc_insert<hanabi_learning_env::HanabiHistoryItem_const&>
              ((vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>
                *)&this->move_history_,__position,&local_98);
  }
  else {
    (__position._M_current)->move = local_98.move;
    (__position._M_current)->player = local_98.player;
    (__position._M_current)->scored = local_98.scored;
    (__position._M_current)->information_token = local_98.information_token;
    (__position._M_current)->color = local_98.color;
    (__position._M_current)->rank = local_98.rank;
    (__position._M_current)->reveal_bitmask = local_98.reveal_bitmask;
    (__position._M_current)->newly_revealed_bitmask = local_98.newly_revealed_bitmask;
    (__position._M_current)->deal_to_player = local_98.deal_to_player;
    ppHVar2 = &(this->move_history_).
               super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppHVar2 = *ppHVar2 + 1;
  }
  AdvanceToNextPlayer(this);
  return;
}

Assistant:

void HanabiState::ApplyMove(HanabiMove move) {
  REQUIRE(MoveIsLegal(move));
  if (deck_.Empty()) {
    --turns_to_play_;
  }
  HanabiHistoryItem history(move);
  history.player = cur_player_;
  switch (move.MoveType()) {
    case HanabiMove::kDeal: {
        history.deal_to_player = PlayerToDeal();
        HanabiHand::CardKnowledge card_knowledge(ParentGame()->NumColors(),
                                      ParentGame()->NumRanks());
        if (parent_game_->ObservationType() == HanabiGame::kSeer){
          card_knowledge.ApplyIsColorHint(move.Color());
          card_knowledge.ApplyIsRankHint(move.Rank());
        }
        hands_[history.deal_to_player].AddCard(
            deck_.DealCard(move.Color(), move.Rank()),
            card_knowledge);
      }
      break;
    case HanabiMove::kDiscard:
      history.information_token = IncrementInformationTokens();
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      hands_[cur_player_].RemoveFromHand(move.CardIndex(), &discard_pile_);
      break;
    case HanabiMove::kPlay:
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      std::tie(history.scored, history.information_token) =
          AddToFireworks(hands_[cur_player_].Cards()[move.CardIndex()]);
      hands_[cur_player_].RemoveFromHand(
          move.CardIndex(), history.scored ? nullptr : &discard_pile_);
      break;
    case HanabiMove::kRevealColor:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandColorBitmask(*HandByOffset(move.TargetOffset()), move.Color());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealColor(move.Color());
      break;
    case HanabiMove::kRevealRank:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandRankBitmask(*HandByOffset(move.TargetOffset()), move.Rank());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealRank(move.Rank());
      break;
    default:
      std::abort();  // Should not be possible.
  }
  move_history_.push_back(history);
  AdvanceToNextPlayer();
}